

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall
pbrt::FormattingParserTarget::Texture
          (FormattingParserTarget *this,string *name,string *type,string *texname,
          ParsedParameterVector *params,FileLoc loc)

{
  bool bVar1;
  mapped_type *pmVar2;
  size_t sVar3;
  reference pvVar4;
  size_type sVar5;
  reference pvVar6;
  ostream *poVar7;
  string *in_RSI;
  char *pcVar8;
  long in_RDI;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_R8;
  vector<unsigned_char,_std::allocator<unsigned_char>_> gamma_1;
  Float gamma;
  vector<unsigned_char,_std::allocator<unsigned_char>_> tri;
  string extra;
  ParameterDictionary dict;
  ParsedParameter *p_1;
  iterator __end3_1;
  iterator __begin3_1;
  ParsedParameterVector *__range3_1;
  bool foundTexture;
  bool foundRGB;
  ParsedParameter *p;
  iterator __end3;
  iterator __begin3;
  ParsedParameterVector *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffb18;
  ParameterDictionary *in_stack_fffffffffffffb20;
  ParameterDictionary *in_stack_fffffffffffffb28;
  ParserTarget *in_stack_fffffffffffffb30;
  undefined7 in_stack_fffffffffffffb38;
  undefined1 in_stack_fffffffffffffb3f;
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  *in_stack_fffffffffffffb40;
  int extra_00;
  FormattingParserTarget *in_stack_fffffffffffffb48;
  RGBColorSpace *in_stack_fffffffffffffb50;
  undefined4 in_stack_fffffffffffffb58;
  Float in_stack_fffffffffffffb5c;
  ParameterDictionary *in_stack_fffffffffffffb60;
  undefined6 in_stack_fffffffffffffb68;
  undefined1 in_stack_fffffffffffffb6e;
  undefined1 in_stack_fffffffffffffb6f;
  allocator<char> *in_stack_fffffffffffffb70;
  undefined7 in_stack_fffffffffffffb80;
  undefined1 in_stack_fffffffffffffb87;
  ParameterDictionary *this_00;
  int indentCount;
  value_type in_stack_fffffffffffffb98;
  value_type in_stack_fffffffffffffb9c;
  string local_438 [32];
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [32];
  string local_3b8 [32];
  string local_398 [39];
  undefined1 local_371 [40];
  undefined1 local_349 [33];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_328;
  string local_310 [32];
  string local_2f0 [32];
  string local_2d0 [39];
  undefined1 local_2a9 [40];
  undefined1 local_281 [41];
  string local_258 [32];
  string local_238 [39];
  allocator<char> local_211;
  string local_210 [39];
  allocator<char> local_1e9;
  string local_1e8 [32];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1c8;
  string local_1b0 [32];
  ParameterDictionary local_190;
  ParsedParameter *local_b8;
  iterator local_b0;
  iterator local_a8;
  byte local_92;
  byte local_91;
  ParsedParameter *local_90;
  iterator local_88;
  iterator local_80;
  int local_5c;
  string local_58 [32];
  _Self local_38;
  _Self local_30 [4];
  string *local_10;
  
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    local_10 = in_RSI;
    local_30[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::find((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)in_stack_fffffffffffffb18,(key_type *)0x4edaca);
    local_38._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::end((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)in_stack_fffffffffffffb18);
    bVar1 = std::operator!=(local_30,&local_38);
    if (bVar1) {
      Warning<std::__cxx11::string_const&>
                ((FileLoc *)in_stack_fffffffffffffb60,
                 (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb50);
      local_5c = Texture::count;
      Texture::count = Texture::count + 1;
      StringPrintf<std::__cxx11::string_const&,int>
                ((char *)in_stack_fffffffffffffb48,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb40,
                 (int *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38));
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb60,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      std::__cxx11::string::operator=((string *)pmVar2,local_58);
      std::__cxx11::string::~string(local_58);
    }
    else {
      pmVar2 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffffb60,
                            (key_type *)
                            CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      std::__cxx11::string::operator=((string *)pmVar2,local_10);
    }
  }
  if (((*(byte *)(in_RDI + 0x11) & 1) != 0) &&
     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18), bVar1))
  {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if (bVar1) {
      local_80 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::begin(in_R8);
      local_88 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::end(&in_stack_fffffffffffffb20->params);
      for (; local_80 != local_88; local_80 = local_80 + 1) {
        local_90 = *local_80;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)&local_90->name,"tex");
        }
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
        if (bVar1) {
          std::__cxx11::string::operator=((string *)&local_90->name,"scale");
        }
      }
    }
    else {
      local_91 = 0;
      local_92 = 0;
      local_a8 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::begin(in_R8);
      local_b0 = InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                 ::end(&in_stack_fffffffffffffb20->params);
      for (; local_a8 != local_b0; local_a8 = local_a8 + 1) {
        local_b8 = *local_a8;
        bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
        if ((!bVar1) ||
           (bVar1 = std::operator!=((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18),
           !bVar1)) {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
          if (bVar1) {
            if ((local_91 & 1) != 0) {
              ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                        (in_stack_fffffffffffffb30,(FileLoc *)in_stack_fffffffffffffb28,
                         (char *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              return;
            }
            sVar3 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::size
                              (&local_b8->floats);
            if (sVar3 != 3) {
              ParserTarget::ErrorExitDeferred<std::__cxx11::string&>
                        (in_stack_fffffffffffffb30,(FileLoc *)in_stack_fffffffffffffb28,
                         (char *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              return;
            }
            pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                               (&local_b8->floats,0);
            in_stack_fffffffffffffb9c = *pvVar4;
            pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                               (&local_b8->floats,1);
            if ((in_stack_fffffffffffffb9c != *pvVar4) ||
               (NAN(in_stack_fffffffffffffb9c) || NAN(*pvVar4))) {
LAB_004edf28:
              ParserTarget::ErrorExitDeferred<std::__cxx11::string&>
                        (in_stack_fffffffffffffb30,(FileLoc *)in_stack_fffffffffffffb28,
                         (char *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              return;
            }
            pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                               (&local_b8->floats,1);
            in_stack_fffffffffffffb98 = *pvVar4;
            pvVar4 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::operator[]
                               (&local_b8->floats,2);
            if ((in_stack_fffffffffffffb98 != *pvVar4) ||
               (NAN(in_stack_fffffffffffffb98) || NAN(*pvVar4))) goto LAB_004edf28;
            local_91 = 1;
            std::__cxx11::string::operator=((string *)local_b8,"float");
            std::__cxx11::string::operator=((string *)&local_b8->name,"scale");
            pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::resize
                      ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)
                       in_stack_fffffffffffffb50,(size_type)in_stack_fffffffffffffb48);
          }
          else {
            if ((local_92 & 1) != 0) {
              ParserTarget::ErrorExitDeferred<std::__cxx11::string_const&>
                        (in_stack_fffffffffffffb30,(FileLoc *)in_stack_fffffffffffffb28,
                         (char *)in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
              return;
            }
            std::__cxx11::string::operator=((string *)&local_b8->name,"tex");
            local_92 = 1;
          }
        }
      }
    }
  }
  this_00 = &local_190;
  pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>::polymorphic_allocator
            ((polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_fffffffffffffb20);
  indentCount = (int)((ulong)&local_190.params.ptr >> 0x20);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::InlinedVector(in_stack_fffffffffffffb40,
                  (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                   *)CONCAT17(in_stack_fffffffffffffb3f,in_stack_fffffffffffffb38),
                  (polymorphic_allocator<pbrt::ParsedParameter_*> *)in_stack_fffffffffffffb30);
  ParameterDictionary::ParameterDictionary
            (in_stack_fffffffffffffb60,
             (ParsedParameterVector *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
             in_stack_fffffffffffffb50);
  InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
  ::~InlinedVector(&in_stack_fffffffffffffb20->params);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    ParameterDictionary::RenameUsedTextures
              (this_00,(map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)CONCAT17(in_stack_fffffffffffffb87,in_stack_fffffffffffffb80));
  }
  std::__cxx11::string::string(local_1b0);
  if ((*(byte *)(in_RDI + 0x11) & 1) != 0) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if (bVar1) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb60,
                 (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (allocator<char> *)in_stack_fffffffffffffb50);
      ParameterDictionary::GetBoolArray
                (in_stack_fffffffffffffb28,(string *)in_stack_fffffffffffffb20);
      std::__cxx11::string::~string(local_1e8);
      std::allocator<char>::~allocator(&local_1e9);
      sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_1c8);
      if (sVar5 == 1) {
        in_stack_fffffffffffffb70 = &local_211;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60,
                   (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                   (allocator<char> *)in_stack_fffffffffffffb50);
        ParameterDictionary::RemoveBool(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string(local_210);
        std::allocator<char>::~allocator(&local_211);
        indent_abi_cxx11_(in_stack_fffffffffffffb48,(int)((ulong)in_stack_fffffffffffffb40 >> 0x20))
        ;
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
        std::__cxx11::string::operator+=(local_1b0,local_238);
        std::__cxx11::string::~string(local_238);
        std::__cxx11::string::~string(local_258);
        pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                           (&local_1c8,0);
        pcVar8 = "\"bilinear\"\n";
        if (*pvVar6 != '\0') {
          pcVar8 = "\"trilinear\"\n";
        }
        std::__cxx11::string::operator+=(local_1b0,pcVar8);
      }
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffb30)
      ;
    }
    in_stack_fffffffffffffb6f =
         std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if (((bool)in_stack_fffffffffffffb6f) ||
       (in_stack_fffffffffffffb6e =
             std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18),
       (bool)in_stack_fffffffffffffb6e)) {
      in_stack_fffffffffffffb60 = (ParameterDictionary *)local_281;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb60,
                 (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (allocator<char> *)in_stack_fffffffffffffb50);
      in_stack_fffffffffffffb5c =
           ParameterDictionary::GetOneFloat(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18,0.0)
      ;
      std::__cxx11::string::~string((string *)(local_281 + 1));
      std::allocator<char>::~allocator((allocator<char> *)local_281);
      local_281._37_4_ = in_stack_fffffffffffffb5c;
      if ((in_stack_fffffffffffffb5c != 0.0) || (NAN(in_stack_fffffffffffffb5c))) {
        in_stack_fffffffffffffb50 = (RGBColorSpace *)local_2a9;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60,
                   (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                   (allocator<char> *)in_stack_fffffffffffffb50);
        ParameterDictionary::RemoveFloat(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
        std::__cxx11::string::~string((string *)(local_2a9 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_2a9);
        indent_abi_cxx11_(in_stack_fffffffffffffb48,(int)((ulong)in_stack_fffffffffffffb40 >> 0x20))
        ;
        StringPrintf<float&>((char *)in_stack_fffffffffffffb48,(float *)in_stack_fffffffffffffb40);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       in_stack_fffffffffffffb50);
        std::__cxx11::string::operator+=(local_1b0,local_2d0);
        std::__cxx11::string::~string(local_2d0);
        std::__cxx11::string::~string(local_310);
        std::__cxx11::string::~string(local_2f0);
      }
      else {
        in_stack_fffffffffffffb48 = (FormattingParserTarget *)local_349;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffb60,
                   (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                   (allocator<char> *)in_stack_fffffffffffffb50);
        ParameterDictionary::GetBoolArray
                  (in_stack_fffffffffffffb28,(string *)in_stack_fffffffffffffb20);
        std::__cxx11::string::~string((string *)(local_349 + 1));
        std::allocator<char>::~allocator((allocator<char> *)local_349);
        sVar5 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&local_328);
        if (sVar5 == 1) {
          in_stack_fffffffffffffb40 =
               (InlinedVector<pbrt::ParsedParameter_*,_8,_pstd::pmr::polymorphic_allocator<pbrt::ParsedParameter_*>_>
                *)local_371;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffffb60,
                     (char *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                     (allocator<char> *)in_stack_fffffffffffffb50);
          ParameterDictionary::RemoveBool(in_stack_fffffffffffffb20,in_stack_fffffffffffffb18);
          std::__cxx11::string::~string((string *)(local_371 + 1));
          std::allocator<char>::~allocator((allocator<char> *)local_371);
          indent_abi_cxx11_(in_stack_fffffffffffffb48,
                            (int)((ulong)in_stack_fffffffffffffb40 >> 0x20));
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         in_stack_fffffffffffffb28,(char *)in_stack_fffffffffffffb20);
          std::__cxx11::string::operator+=(local_1b0,local_398);
          std::__cxx11::string::~string(local_398);
          std::__cxx11::string::~string(local_3b8);
          pvVar6 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                             (&local_328,0);
          pcVar8 = "\"linear\"\n";
          if (*pvVar6 != '\0') {
            pcVar8 = "\"sRGB\"\n";
          }
          std::__cxx11::string::operator+=(local_1b0,pcVar8);
        }
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                   in_stack_fffffffffffffb30);
      }
    }
  }
  extra_00 = (int)((ulong)in_stack_fffffffffffffb40 >> 0x20);
  if ((*(byte *)(in_RDI + 0x11) & 1) == 0) {
    indent_abi_cxx11_(in_stack_fffffffffffffb48,extra_00);
    Printf<std::__cxx11::string,std::__cxx11::string_const&,std::__cxx11::string_const&,std::__cxx11::string_const&>
              ((char *)in_stack_fffffffffffffb70,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffb6f,
                        CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb60,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffb50);
    std::__cxx11::string::~string(local_418);
  }
  else {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffb20,(char *)in_stack_fffffffffffffb18);
    if (bVar1) {
      indent_abi_cxx11_(in_stack_fffffffffffffb48,extra_00);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffb60,
                   (key_type *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      Printf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&>
                ((char *)in_stack_fffffffffffffb60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb48);
      std::__cxx11::string::~string(local_3d8);
    }
    else {
      indent_abi_cxx11_(in_stack_fffffffffffffb48,extra_00);
      std::
      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                    *)in_stack_fffffffffffffb60,
                   (key_type *)CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58));
      Printf<std::__cxx11::string,std::__cxx11::string&,std::__cxx11::string_const&,std::__cxx11::string_const&>
                ((char *)in_stack_fffffffffffffb70,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT17(in_stack_fffffffffffffb6f,
                          CONCAT16(in_stack_fffffffffffffb6e,in_stack_fffffffffffffb68)),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_fffffffffffffb5c,in_stack_fffffffffffffb58),
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 in_stack_fffffffffffffb50);
      std::__cxx11::string::~string(local_3f8);
    }
  }
  poVar7 = std::operator<<((ostream *)&std::cout,local_1b0);
  ParameterDictionary::ToParameterList_abi_cxx11_
            ((ParameterDictionary *)CONCAT44(in_stack_fffffffffffffb9c,in_stack_fffffffffffffb98),
             indentCount);
  std::operator<<(poVar7,local_438);
  std::__cxx11::string::~string(local_438);
  std::__cxx11::string::~string(local_1b0);
  ParameterDictionary::~ParameterDictionary((ParameterDictionary *)0x4eeb8e);
  return;
}

Assistant:

void FormattingParserTarget::Texture(const std::string &name, const std::string &type,
                                     const std::string &texname,
                                     ParsedParameterVector params, FileLoc loc) {
    if (upgrade) {
        if (definedTextures.find(name) != definedTextures.end()) {
            static int count = 0;
            Warning(&loc, "%s: renaming multiply-defined texture", name);
            definedTextures[name] = StringPrintf("%s-renamed-%d", name, count++);
        } else
            definedTextures[name] = name;
    }

    if (upgrade && texname == "scale") {
        // This is easier to do in the raw ParsedParameterVector...
        if (type == "float") {
            for (ParsedParameter *p : params) {
                if (p->name == "tex1")
                    p->name = "tex";
                if (p->name == "tex2")
                    p->name = "scale";
            }
        } else {
            // more subtle: rename one of them as float, but need one of them
            // to be an RGB and spectrally constant...
            bool foundRGB = false, foundTexture = false;
            for (ParsedParameter *p : params) {
                if (p->name != "tex1" && p->name != "tex2")
                    continue;

                if (p->type == "rgb") {
                    if (foundRGB) {
                        ErrorExitDeferred(
                            &p->loc,
                            "Two \"rgb\" textures found for \"scale\" "
                            "texture \"%s\". Please manually edit the file to "
                            "upgrade.",
                            name);
                        return;
                    }
                    if (p->floats.size() != 3) {
                        ErrorExitDeferred(
                            &p->loc, "Didn't find 3 values for \"rgb\" \"%s\".", p->name);
                        return;
                    }
                    if (p->floats[0] != p->floats[1] || p->floats[1] != p->floats[2]) {
                        ErrorExitDeferred(&p->loc,
                                          "Non-constant \"rgb\" value found for "
                                          "\"scale\" texture parameter \"%s\". Please "
                                          "manually "
                                          "edit the file to upgrade.",
                                          p->name);
                        return;
                    }

                    foundRGB = true;
                    p->type = "float";
                    p->name = "scale";
                    p->floats.resize(1);
                } else {
                    if (foundTexture) {
                        ErrorExitDeferred(
                            &p->loc,
                            "Two textures found for \"scale\" "
                            "texture \"%s\". Please manually edit the file to "
                            "upgrade.",
                            name);
                        return;
                    }
                    p->name = "tex";
                    foundTexture = true;
                }
            }
        }
    }

    ParameterDictionary dict(params, RGBColorSpace::sRGB);
    if (upgrade)
        dict.RenameUsedTextures(definedTextures);

    std::string extra;
    if (upgrade) {
        if (texname == "imagemap") {
            std::vector<uint8_t> tri = dict.GetBoolArray("trilinear");
            if (tri.size() == 1) {
                dict.RemoveBool("trilinear");
                extra += indent(1) + "\"string filter\" ";
                extra += tri[0] != 0u ? "\"trilinear\"\n" : "\"bilinear\"\n";
            }
        }

        if (texname == "imagemap" || texname == "ptex") {
            Float gamma = dict.GetOneFloat("gamma", 0);
            if (gamma != 0) {
                dict.RemoveFloat("gamma");
                extra +=
                    indent(1) + StringPrintf("\"string encoding \" \"gamma %f\" ", gamma);
            } else {
                std::vector<uint8_t> gamma = dict.GetBoolArray("gamma");
                if (gamma.size() == 1) {
                    dict.RemoveBool("gamma");
                    extra += indent(1) + "\"string encoding\" ";
                    extra += gamma[0] != 0u ? "\"sRGB\"\n" : "\"linear\"\n";
                }
            }
        }
    }

    if (upgrade) {
        if (type == "color")
            Printf("%sTexture \"%s\" \"spectrum\" \"%s\"\n", indent(),
                   definedTextures[name], texname);
        else
            Printf("%sTexture \"%s\" \"%s\" \"%s\"\n", indent(), definedTextures[name],
                   type, texname);
    } else
        Printf("%sTexture \"%s\" \"%s\" \"%s\"\n", indent(), name, type, texname);

    std::cout << extra << dict.ToParameterList(catIndentCount);
}